

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O2

void __thiscall crnlib::crn_comp::optimize_alpha_selectors(crn_comp *this)

{
  vector<unsigned_short> *this_00;
  unsigned_long_long *puVar1;
  unsigned_short *puVar2;
  ushort uVar3;
  ulong uVar4;
  uint16 i_1;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  uint16 i_2;
  ulong uVar9;
  uint min_error;
  uint uVar10;
  ulong uVar11;
  uint16 i;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  vector<unsigned_short> indices;
  vector<unsigned_long_long> selectors;
  uint8 D6 [4096];
  ulong uVar8;
  
  this_00 = this->m_selector_remaping + 1;
  uVar10 = (this->m_alpha_selectors).m_size;
  uVar3 = (ushort)uVar10;
  vector<unsigned_short>::resize(this_00,uVar10 & 0xffff,false);
  for (uVar13 = 0; uVar13 != 0x1000; uVar13 = uVar13 + 1) {
    D6[uVar13] = (&DAT_0018ce2b)[(uint)(uVar13 >> 3) & 7 ^ (uint)(uVar13 >> 9) & 0x7fffff] +
                 (&DAT_0018ce2b)[((uint)(uVar13 >> 6) & 0x3ffffff ^ (uint)uVar13) & 7];
  }
  vector<unsigned_long_long>::vector(&selectors,uVar10 & 0xffff);
  vector<unsigned_short>::vector(&indices,uVar10 & 0xffff);
  puVar1 = (this->m_alpha_selectors).m_p;
  for (uVar13 = 0; uVar3 != uVar13; uVar13 = uVar13 + 1) {
    selectors.m_p[uVar13] = puVar1[uVar13];
    indices.m_p[uVar13] = (unsigned_short)uVar13;
  }
  puVar2 = this_00->m_p;
  uVar13 = 0;
  uVar8 = (ulong)uVar3;
  while (uVar7 = uVar8 - 1, uVar8 != 0) {
    uVar4 = 0;
    uVar10 = 0xffffffff;
    for (uVar9 = 0; uVar9 != uVar8; uVar9 = uVar9 + 1) {
      uVar11 = selectors.m_p[uVar9] << 6;
      uVar12 = 0;
      uVar5 = uVar13;
      lVar6 = 8;
      while (bVar14 = lVar6 != 0, lVar6 = lVar6 + -1, bVar14) {
        uVar12 = uVar12 + D6[(uint)uVar5 & 0x3f | (uint)uVar11 & 0xfc0];
        uVar11 = uVar11 >> 6;
        uVar5 = uVar5 >> 6;
      }
      if (uVar12 < uVar10) {
        uVar10 = uVar12;
        uVar4 = uVar9 & 0xffffffff;
      }
    }
    uVar4 = uVar4 & 0xffff;
    uVar13 = selectors.m_p[uVar4];
    puVar2[indices.m_p[uVar4]] = uVar3 - (short)uVar8;
    selectors.m_p[uVar4] = selectors.m_p[uVar7];
    indices.m_p[uVar4] = indices.m_p[uVar7];
    uVar8 = uVar7;
  }
  pack_alpha_selectors(this,&this->m_packed_alpha_selectors,this_00);
  vector<unsigned_short>::~vector(&indices);
  vector<unsigned_long_long>::~vector(&selectors);
  return;
}

Assistant:

void crn_comp::optimize_alpha_selectors()
    {
        crnlib::vector<uint16>& remapping = m_selector_remaping[cAlpha0];
        uint16 n = m_alpha_selectors.size();
        remapping.resize(n);

        uint8 d[] = { 0, 2, 3, 3, 5, 5, 4, 4 };

        uint8 D6[0x1000];
        for (uint16 i = 0; i < 0x1000; i++)
        {
            D6[i] = d[(i ^ i >> 6) & 7] + d[(i >> 3 ^ i >> 9) & 7];
        }

        crnlib::vector<uint64> selectors(n);
        crnlib::vector<uint16> indices(n);
        for (uint16 i = 0; i < n; i++)
        {
            selectors[i] = m_alpha_selectors[i];
            indices[i] = i;
        }
        uint64 selected_selector = 0;
        for (uint16 left = n; left;)
        {
            uint16 selected_index = 0;
            uint min_error = cUINT32_MAX;
            for (uint16 i = 0; i < left; i++)
            {
                uint error = 0;
                for (uint64 selector = selectors[i] << 6, delta_selector = selected_selector, j = 0; j < 8; j++, selector >>= 6, delta_selector >>= 6)
                {
                    error += D6[(selector & 0xFC0) | (delta_selector & 0x3F)];
                }
                if (error < min_error)
                {
                    min_error = error;
                    selected_index = i;
                }
            }
            selected_selector = selectors[selected_index];
            remapping[indices[selected_index]] = n - left;
            left--;
            selectors[selected_index] = selectors[left];
            indices[selected_index] = indices[left];
        }

        pack_alpha_selectors(m_packed_alpha_selectors, remapping);
    }